

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panning.cpp
# Opt level: O1

void aluInitRenderer(ALCdevice *device,int hrtf_id,HrtfRequestMode hrtf_appreq,
                    HrtfRequestMode hrtf_userreq)

{
  intrusive_ptr<HrtfStore> *this;
  RenderMode *pRVar1;
  float *pfVar2;
  _Alloc_hider _Var3;
  DirectHrtfState *pDVar4;
  char *devName;
  pointer paVar5;
  BFormatDec *pBVar6;
  pointer pSVar7;
  pointer pbVar8;
  pointer pcVar9;
  bs2b *ptr;
  Uhj2Encoder *ptr_00;
  HrtfStore *Hrtf;
  byte bVar10;
  int iVar11;
  ALCenum AVar12;
  uint uVar13;
  ulong uVar14;
  pointer pSVar15;
  anon_union_16_2_dde17770_for_FlexArray<float,_16UL>_3 *paVar16;
  bs2b *pbVar17;
  code *pcVar18;
  Uhj2Encoder *__s;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  pointer pSVar22;
  undefined1 auVar23 [8];
  ulong uVar24;
  undefined1 *puVar25;
  size_t sVar26;
  char *pcVar27;
  DistanceComp *this_00;
  BFChannelConfig BVar28;
  AmbDecConf *conf;
  pointer pbVar29;
  ALuint order;
  undefined1 *puVar30;
  bool bVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  span<const_AngularPoint,_18446744073709551615UL> AmbiPoints;
  HrtfStorePtr old_hrtf;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> decopt;
  ALuint speakermap [16];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> modeopt
  ;
  float (*local_1a0) [16];
  intrusive_ptr<HrtfStore> local_190;
  pointer local_188;
  undefined1 local_180 [8];
  BFormatDec **local_178;
  size_type sStack_170;
  BFormatDec *local_168;
  float afStack_160 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  float local_10c;
  undefined1 local_108 [8];
  pointer pbStack_100;
  undefined1 auStack_f8 [16];
  undefined8 uStack_e8;
  Elevation *pEStack_e0;
  HrirArray *local_d8;
  vector<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_> vStack_d0;
  float local_b8 [4];
  pointer local_a8;
  pointer paStack_a0;
  pointer local_98;
  float afStack_90 [4];
  pointer local_80;
  pointer paStack_78;
  pointer local_70;
  DistanceComp *local_60;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  this = &device->mHrtf;
  local_190.mPtr = (device->mHrtf).mPtr;
  pDVar4 = (device->mHrtfState)._M_t.
           super___uniq_ptr_impl<DirectHrtfState,_std::default_delete<DirectHrtfState>_>._M_t.
           super__Tuple_impl<0UL,_DirectHrtfState_*,_std::default_delete<DirectHrtfState>_>.
           super__Head_base<0UL,_DirectHrtfState_*,_false>._M_head_impl;
  (device->mHrtfState)._M_t.
  super___uniq_ptr_impl<DirectHrtfState,_std::default_delete<DirectHrtfState>_>._M_t.
  super__Tuple_impl<0UL,_DirectHrtfState_*,_std::default_delete<DirectHrtfState>_>.
  super__Head_base<0UL,_DirectHrtfState_*,_false>._M_head_impl = (DirectHrtfState *)0x0;
  (device->mHrtf).mPtr = (HrtfStore *)0x0;
  if (pDVar4 != (DirectHrtfState *)0x0) {
    al_free(pDVar4);
  }
  local_108 = (undefined1  [8])0x0;
  al::intrusive_ptr<HrtfStore>::operator=(this,(intrusive_ptr<HrtfStore> *)local_108);
  al::intrusive_ptr<HrtfStore>::~intrusive_ptr((intrusive_ptr<HrtfStore> *)local_108);
  (device->HrtfName)._M_string_length = 0;
  *(device->HrtfName)._M_dataplus._M_p = '\0';
  device->mRenderMode = Normal;
  if (device->FmtChans == DevFmtChannelsDefault) {
    bVar10 = device->IsHeadphones;
    if (device->Type != Loopback) {
      ConfigValueStr_abi_cxx11_
                (&local_158,(device->DeviceName)._M_dataplus._M_p,(char *)0x0,"stereo-mode");
      auVar23 = local_108;
      local_108 = (undefined1  [8])((ulong)local_108 & 0xffffffffffffff00);
      pbStack_100 = (pointer)0x0;
      auStack_f8._0_8_ = (pointer)0x0;
      auStack_f8._8_8_ = 0;
      uStack_e8 = (Field *)0x0;
      if (local_158.mHasValue == true) {
        pbStack_100 = (pointer)(auStack_f8 + 8);
        _Var3._M_p = (pointer)((long)&local_158.field_1 + 0x10);
        if (local_158.field_1.mValue._M_dataplus._M_p == (_Alloc_hider)_Var3._M_p) {
          uStack_e8 = (Field *)local_158.field_1._24_8_;
        }
        else {
          pbStack_100 = (pointer)local_158.field_1.mValue._M_dataplus._M_p;
        }
        auStack_f8._9_7_ = local_158.field_1._17_7_;
        auStack_f8[8] = local_158.field_1.mDummy[0x10];
        auStack_f8._0_8_ = local_158.field_1.mValue._M_string_length;
        local_158.field_1.mValue._M_string_length = 0;
        local_158.field_1.mDummy[0x10] = '\0';
        local_108._1_7_ = auVar23._1_7_;
        local_108[0] = 1;
        local_158.field_1.mValue._M_dataplus._M_p = (_Alloc_hider)_Var3._M_p;
      }
      pbVar29 = pbStack_100;
      if (local_108[0] == '\x01') {
        iVar11 = al::strcasecmp((char *)pbStack_100,"headphones");
        if (iVar11 == 0) {
          bVar10 = 1;
        }
        else {
          iVar11 = al::strcasecmp((char *)pbVar29,"speakers");
          if (iVar11 == 0) {
            bVar10 = 0;
          }
          else {
            iVar11 = al::strcasecmp((char *)pbVar29,"auto");
            if ((iVar11 != 0) && (0 < (int)gLogLevel)) {
              fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected stereo-mode: %s\n",pbVar29);
            }
          }
        }
      }
      if ((local_108[0] == '\x01') && (pbStack_100 != (pointer)(auStack_f8 + 8))) {
        operator_delete(pbStack_100,auStack_f8._8_8_ + 1);
      }
    }
    pRVar1 = &device->mRenderMode;
    if (hrtf_userreq == Hrtf_Enable) {
      device->HrtfStatus = 3;
LAB_0015a315:
      if ((device->HrtfList).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (device->HrtfList).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        EnumerateHrtf_abi_cxx11_
                  ((vector<std::string> *)&local_158,(device->DeviceName)._M_dataplus._M_p);
        local_108 = (undefined1  [8])
                    (device->HrtfList).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        pbStack_100 = (device->HrtfList).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        auStack_f8._0_8_ =
             (device->HrtfList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (device->HrtfList).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_158._0_8_;
        (device->HrtfList).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)local_158.field_1.mValue._M_dataplus._M_p;
        (device->HrtfList).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_158.field_1.mValue._M_string_length;
        local_158._0_8_ = (pointer)0x0;
        local_158.field_1.mValue._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
        local_158.field_1.mValue._M_string_length = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                   *)local_108);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                   *)&local_158);
      }
      if ((-1 < hrtf_id) &&
         (pbVar29 = (device->HrtfList).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         (ulong)(uint)hrtf_id <
         (ulong)((long)(device->HrtfList).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar29 >> 5))) {
        GetLoadedHrtf((string *)local_108,(char *)(pbVar29 + (uint)hrtf_id),
                      (ALuint)(device->DeviceName)._M_dataplus._M_p);
        if (local_108 != (undefined1  [8])0x0) {
          al::intrusive_ptr<HrtfStore>::operator=(this,(intrusive_ptr<HrtfStore> *)local_108);
          std::__cxx11::string::_M_assign((string *)&device->HrtfName);
        }
        al::intrusive_ptr<HrtfStore>::~intrusive_ptr((intrusive_ptr<HrtfStore> *)local_108);
      }
      if (this->mPtr == (HrtfStore *)0x0) {
        pbVar29 = (device->HrtfList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar8 = (device->HrtfList).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar29 != pbVar8) {
          pcVar9 = (device->DeviceName)._M_dataplus._M_p;
          do {
            GetLoadedHrtf((string *)local_108,(char *)pbVar29,(ALuint)pcVar9);
            if (local_108 != (undefined1  [8])0x0) {
              al::intrusive_ptr<HrtfStore>::operator=(this,(intrusive_ptr<HrtfStore> *)local_108);
              std::__cxx11::string::_M_assign((string *)&device->HrtfName);
              al::intrusive_ptr<HrtfStore>::~intrusive_ptr((intrusive_ptr<HrtfStore> *)local_108);
              break;
            }
            al::intrusive_ptr<HrtfStore>::~intrusive_ptr((intrusive_ptr<HrtfStore> *)local_108);
            pbVar29 = pbVar29 + 1;
          } while (pbVar29 != pbVar8);
        }
      }
      if (this->mPtr == (HrtfStore *)0x0) {
        AVar12 = 5;
LAB_0015a573:
        device->HrtfStatus = AVar12;
        goto LAB_0015a579;
      }
      local_108 = (undefined1  [8])0x0;
      if (local_190.mPtr != (HrtfStore *)0x0) {
        HrtfStore::release(local_190.mPtr);
      }
      local_190.mPtr = (HrtfStore *)local_108;
      local_108 = (undefined1  [8])0x0;
      al::intrusive_ptr<HrtfStore>::~intrusive_ptr((intrusive_ptr<HrtfStore> *)local_108);
      if ((anonymous_namespace)::InitHrtfPanning(ALCdevice*)::CornerElev == '\0') {
        aluInitRenderer();
      }
      if ((anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O == '\0') {
        aluInitRenderer();
      }
      if ((anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O == '\0') {
        aluInitRenderer();
      }
      device->mRenderMode = Hrtf;
      ConfigValueStr_abi_cxx11_
                (&local_158,(device->DeviceName)._M_dataplus._M_p,(char *)0x0,"hrtf-mode");
      auVar23 = local_108;
      local_108 = (undefined1  [8])((ulong)local_108 & 0xffffffffffffff00);
      pbStack_100 = (pointer)0x0;
      auStack_f8._0_8_ = (pointer)0x0;
      auStack_f8._8_8_ = 0;
      uStack_e8 = (Field *)0x0;
      if (local_158.mHasValue == true) {
        pbStack_100 = (pointer)(auStack_f8 + 8);
        _Var3._M_p = (pointer)((long)&local_158.field_1 + 0x10);
        if (local_158.field_1.mValue._M_dataplus._M_p == (_Alloc_hider)_Var3._M_p) {
          uStack_e8 = (Field *)local_158.field_1._24_8_;
        }
        else {
          pbStack_100 = (pointer)local_158.field_1.mValue._M_dataplus._M_p;
        }
        auStack_f8._9_7_ = local_158.field_1._17_7_;
        auStack_f8[8] = local_158.field_1.mDummy[0x10];
        auStack_f8._0_8_ = local_158.field_1.mValue._M_string_length;
        local_158.field_1.mValue._M_string_length = 0;
        local_158.field_1.mDummy[0x10] = '\0';
        local_108._1_7_ = auVar23._1_7_;
        local_108[0] = 1;
        local_158.field_1.mValue._M_dataplus._M_p = (_Alloc_hider)_Var3._M_p;
      }
      pcVar27 = (char *)pbStack_100;
      uVar21 = 1;
      if (local_108[0] == '\x01') {
        iVar11 = al::strcasecmp((char *)pbStack_100,"basic");
        if ((iVar11 == 0) || (iVar11 = al::strcasecmp(pcVar27,"ambi3"), iVar11 == 0)) {
          if ((int)gLogLevel < 1) {
            pcVar27 = "ambi2";
          }
          else {
            fprintf((FILE *)gLogFile,
                    "[ALSOFT] (EE) HRTF mode \"%s\" deprecated, substituting \"%s\"\n",pcVar27,
                    "ambi2");
            pcVar27 = "ambi2";
          }
        }
        puVar25 = (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::hrtf_modes;
        iVar11 = al::strcasecmp(pcVar27,(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::
                                        hrtf_modes);
        if (iVar11 != 0) {
          puVar25 = (undefined *)0x1920f0;
          iVar11 = al::strcasecmp(pcVar27,(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::
                                          hrtf_modes + 0x10);
          if (iVar11 != 0) {
            iVar11 = al::strcasecmp(pcVar27,(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::
                                            hrtf_modes + 0x20);
            puVar25 = &DAT_00192110;
            if (iVar11 == 0) {
              puVar25 = (undefined *)0x192100;
            }
          }
        }
        if (puVar25 == &DAT_00192110) {
          if (0 < (int)gLogLevel) {
            fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected hrtf-mode: %s\n",pcVar27);
          }
          uVar21 = 1;
        }
        else {
          uVar21 = *(uint *)(puVar25 + 0xc);
          *pRVar1 = *(RenderMode *)(puVar25 + 8);
        }
      }
      if ((local_108[0] == '\x01') && (pbStack_100 != (pointer)(auStack_f8 + 8))) {
        operator_delete(pbStack_100,auStack_f8._8_8_ + 1);
      }
      if (2 < (int)gLogLevel) {
        aluInitRenderer();
      }
      if (uVar21 < 2) {
        local_1a0 = (float (*) [16])(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiMatrix1O
        ;
        local_188 = (pointer)&(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O;
        puVar30 = (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O;
        puVar25 = (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiOrderHFGain1O;
      }
      else {
        local_1a0 = (float (*) [16])(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiMatrix2O
        ;
        local_188 = (pointer)&(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O;
        puVar30 = (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O;
        puVar25 = (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiOrderHFGain2O;
      }
      device->mAmbiOrder = uVar21;
      sVar26 = ((ulong)uVar21 + 1) * ((ulong)uVar21 + 1);
      if (sVar26 != 0) {
        lVar19 = 0;
        do {
          (device->Dry).AmbiMap._M_elems[lVar19] =
               (BFChannelConfig)((ulong)AmbiIndex::FromACN._M_elems[lVar19] << 0x20 | 0x3f800000);
          lVar19 = lVar19 + 1;
        } while (sVar26 - lVar19 != 0);
      }
      uVar13 = ChannelsFromDevFmt(device->FmtChans,device->mAmbiOrder);
      anon_unknown.dwarf_20cafe::AllocChannels(device,sVar26,(ulong)uVar13);
      Hrtf = this->mPtr;
      DirectHrtfState::Create((DirectHrtfState *)local_108,sVar26);
      AmbiPoints.mDataEnd = local_188;
      AmbiPoints.mData = (pointer)puVar30;
      DirectHrtfState::build
                ((DirectHrtfState *)local_108,Hrtf,AmbiPoints,local_1a0,
                 (span<const_float,_4UL>)puVar25);
      auVar23 = local_108;
      local_108 = (undefined1  [8])0x0;
      pDVar4 = (device->mHrtfState)._M_t.
               super___uniq_ptr_impl<DirectHrtfState,_std::default_delete<DirectHrtfState>_>._M_t.
               super__Tuple_impl<0UL,_DirectHrtfState_*,_std::default_delete<DirectHrtfState>_>.
               super__Head_base<0UL,_DirectHrtfState_*,_false>._M_head_impl;
      (device->mHrtfState)._M_t.
      super___uniq_ptr_impl<DirectHrtfState,_std::default_delete<DirectHrtfState>_>._M_t.
      super__Tuple_impl<0UL,_DirectHrtfState_*,_std::default_delete<DirectHrtfState>_>.
      super__Head_base<0UL,_DirectHrtfState_*,_false>._M_head_impl = (DirectHrtfState *)auVar23;
      if (pDVar4 != (DirectHrtfState *)0x0) {
        al_free(pDVar4);
      }
      anon_unknown.dwarf_20cafe::InitNearFieldCtrl(device,Hrtf->field->distance,uVar21,true);
      if (local_108 != (undefined1  [8])0x0) {
        al_free((void *)local_108);
      }
      pcVar18 = ALCdevice::ProcessHrtf;
    }
    else {
      if (hrtf_userreq == Hrtf_Default) {
        bVar10 = hrtf_appreq != Hrtf_Disable & bVar10;
        if ((hrtf_appreq == Hrtf_Enable) || (iVar11 = 0xb, bVar10 != 0)) {
          device->HrtfStatus = (uint)bVar10 + (uint)bVar10 * 2 + 1;
          iVar11 = 0;
        }
        if (iVar11 == 0) goto LAB_0015a315;
        if (iVar11 != 0xb) goto LAB_0015ab46;
      }
      else {
        AVar12 = 2;
        if (hrtf_appreq == Hrtf_Enable) goto LAB_0015a573;
      }
LAB_0015a579:
      local_108 = (undefined1  [8])0x0;
      if (local_190.mPtr != (HrtfStore *)0x0) {
        HrtfStore::release(local_190.mPtr);
      }
      local_190.mPtr = (HrtfStore *)local_108;
      local_108 = (undefined1  [8])0x0;
      al::intrusive_ptr<HrtfStore>::~intrusive_ptr((intrusive_ptr<HrtfStore> *)local_108);
      device->mRenderMode = Pairwise;
      if (device->Type != Loopback) {
        pcVar27 = (device->DeviceName)._M_dataplus._M_p;
        ConfigValueInt(local_108,pcVar27,(char *)0x0);
        fVar32 = 0.0;
        if (local_108[0] != 0) {
          fVar32 = (float)local_108._4_4_;
        }
        if ((local_108[0] & (int)fVar32 - 1U < 6) == 1) {
          pbVar17 = (bs2b *)bs2b::operator_new((bs2b *)0x2c,(size_t)pcVar27);
          pbVar17->history[0].lo = 0.0;
          pbVar17->history[0].hi = 0.0;
          pbVar17->history[1].lo = 0.0;
          pbVar17->history[1].hi = 0.0;
          pbVar17->a0_hi = 0.0;
          pbVar17->a1_hi = 0.0;
          pbVar17->b1_hi = 0.0;
          pbVar17->history[0].lo = 0.0;
          pbVar17->level = 0;
          pbVar17->srate = 0;
          pbVar17->a0_lo = 0.0;
          pbVar17->b1_lo = 0.0;
          ptr = (device->Bs2b)._M_t.super___uniq_ptr_impl<bs2b,_std::default_delete<bs2b>_>._M_t.
                super__Tuple_impl<0UL,_bs2b_*,_std::default_delete<bs2b>_>.
                super__Head_base<0UL,_bs2b_*,_false>._M_head_impl;
          (device->Bs2b)._M_t.super___uniq_ptr_impl<bs2b,_std::default_delete<bs2b>_>._M_t.
          super__Tuple_impl<0UL,_bs2b_*,_std::default_delete<bs2b>_>.
          super__Head_base<0UL,_bs2b_*,_false>._M_head_impl = pbVar17;
          if (ptr != (bs2b *)0x0) {
            al_free(ptr);
          }
          bs2b_set_params((device->Bs2b)._M_t.
                          super___uniq_ptr_impl<bs2b,_std::default_delete<bs2b>_>._M_t.
                          super__Tuple_impl<0UL,_bs2b_*,_std::default_delete<bs2b>_>.
                          super__Head_base<0UL,_bs2b_*,_false>._M_head_impl,(int)fVar32,
                          device->Frequency);
          if (2 < (int)gLogLevel) {
            aluInitRenderer();
          }
          anon_unknown.dwarf_20cafe::InitPanning(device,false,false);
          pcVar18 = ALCdevice::ProcessBs2b;
          goto LAB_0015ab34;
        }
      }
      pcVar27 = (device->DeviceName)._M_dataplus._M_p;
      ConfigValueStr_abi_cxx11_(&local_158,pcVar27,(char *)0x0,"stereo-encoding");
      auVar23 = local_108;
      local_108 = (undefined1  [8])((ulong)local_108 & 0xffffffffffffff00);
      pbStack_100 = (pointer)0x0;
      auStack_f8._0_8_ = (pointer)0x0;
      auStack_f8._8_8_ = 0;
      uStack_e8 = (Field *)0x0;
      if (local_158.mHasValue == true) {
        pbStack_100 = (pointer)(auStack_f8 + 8);
        _Var3._M_p = (pointer)((long)&local_158.field_1 + 0x10);
        if (local_158.field_1.mValue._M_dataplus._M_p == (_Alloc_hider)_Var3._M_p) {
          uStack_e8 = (Field *)local_158.field_1._24_8_;
        }
        else {
          pbStack_100 = (pointer)local_158.field_1.mValue._M_dataplus._M_p;
        }
        auStack_f8._9_7_ = local_158.field_1._17_7_;
        auStack_f8[8] = local_158.field_1.mDummy[0x10];
        auStack_f8._0_8_ = local_158.field_1.mValue._M_string_length;
        local_158.field_1.mValue._M_string_length = 0;
        local_158.field_1.mDummy[0x10] = '\0';
        local_108._1_7_ = auVar23._1_7_;
        local_108[0] = 1;
        pcVar27 = (char *)local_158.field_1.mValue._M_dataplus._M_p;
        local_158.field_1.mValue._M_dataplus._M_p = (_Alloc_hider)_Var3._M_p;
      }
      pbVar29 = pbStack_100;
      if (local_108[0] == '\x01') {
        pcVar27 = "uhj";
        iVar11 = al::strcasecmp((char *)pbStack_100,"uhj");
        if (iVar11 == 0) {
          *pRVar1 = Normal;
        }
        else {
          pcVar27 = "panpot";
          iVar11 = al::strcasecmp((char *)pbVar29,"panpot");
          if ((iVar11 != 0) && (0 < (int)gLogLevel)) {
            pcVar27 = "[ALSOFT] (EE) Unexpected stereo-encoding: %s\n";
            fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected stereo-encoding: %s\n",pbVar29);
          }
        }
      }
      if ((local_108[0] == '\x01') && (pbStack_100 != (pointer)(auStack_f8 + 8))) {
        pcVar27 = (char *)(auStack_f8._8_8_ + 1);
        operator_delete(pbStack_100,(ulong)pcVar27);
      }
      if (*pRVar1 == Normal) {
        __s = (Uhj2Encoder *)Uhj2Encoder::operator_new((Uhj2Encoder *)0x4000,(size_t)pcVar27);
        memset(__s,0,0x4000);
        ptr_00 = (device->Uhj_Encoder)._M_t.
                 super___uniq_ptr_impl<Uhj2Encoder,_std::default_delete<Uhj2Encoder>_>._M_t.
                 super__Tuple_impl<0UL,_Uhj2Encoder_*,_std::default_delete<Uhj2Encoder>_>.
                 super__Head_base<0UL,_Uhj2Encoder_*,_false>._M_head_impl;
        (device->Uhj_Encoder)._M_t.
        super___uniq_ptr_impl<Uhj2Encoder,_std::default_delete<Uhj2Encoder>_>._M_t.
        super__Tuple_impl<0UL,_Uhj2Encoder_*,_std::default_delete<Uhj2Encoder>_>.
        super__Head_base<0UL,_Uhj2Encoder_*,_false>._M_head_impl = __s;
        if (ptr_00 != (Uhj2Encoder *)0x0) {
          al_free(ptr_00);
        }
        if (2 < (int)gLogLevel) {
          aluInitRenderer();
        }
        device->mAmbiOrder = 1;
        lVar19 = 0;
        do {
          BVar28.Index._0_1_ = AmbiIndex::FromFuMa._M_elems[lVar19];
          BVar28.Scale = 1.0 / AmbiScale::FromFuMa._M_elems[AmbiIndex::FromFuMa._M_elems[lVar19]];
          BVar28.Index._1_3_ = 0;
          (device->Dry).AmbiMap._M_elems[lVar19] = BVar28;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 3);
        uVar13 = ChannelsFromDevFmt(device->FmtChans,device->mAmbiOrder);
        anon_unknown.dwarf_20cafe::AllocChannels(device,3,(ulong)uVar13);
        pcVar18 = ALCdevice::ProcessUhj;
      }
      else {
        if (2 < (int)gLogLevel) {
          aluInitRenderer();
        }
        anon_unknown.dwarf_20cafe::InitPanning(device,false,false);
        pcVar18 = ALCdevice::ProcessAmbiDec;
      }
    }
LAB_0015ab34:
    device->PostProcess = (PostProc)pcVar18;
    *(undefined8 *)&device->field_0x6e98 = 0;
    goto LAB_0015ab46;
  }
  local_108 = (undefined1  [8])0x0;
  if (local_190.mPtr != (HrtfStore *)0x0) {
    HrtfStore::release(local_190.mPtr);
  }
  local_190.mPtr = (HrtfStore *)local_108;
  local_108 = (undefined1  [8])0x0;
  al::intrusive_ptr<HrtfStore>::~intrusive_ptr((intrusive_ptr<HrtfStore> *)local_108);
  if (hrtf_appreq == Hrtf_Enable) {
    device->HrtfStatus = 5;
  }
  bVar31 = true;
  pcVar27 = (char *)0x0;
  switch(device->FmtChans) {
  case DevFmtQuad:
    pcVar27 = "quad";
    break;
  case DevFmtX51:
  case DevFmtX51Rear:
    pcVar27 = "surround51";
    break;
  case DevFmtX61:
    pcVar27 = "surround61";
    break;
  case DevFmtX71:
    pcVar27 = "surround71";
    break;
  default:
    goto switchD_001598d6_caseD_6;
  }
  bVar31 = false;
switchD_001598d6_caseD_6:
  devName = (device->DeviceName)._M_dataplus._M_p;
  local_108 = (undefined1  [8])auStack_f8;
  conf = (AmbDecConf *)0x0;
  pbStack_100 = (pointer)0x0;
  auStack_f8._0_8_ = auStack_f8._0_8_ & 0xffffffffffffff00;
  uStack_e8 = (Field *)0x0;
  pEStack_e0 = (Elevation *)0x0;
  local_d8 = (HrirArray *)0x0;
  vStack_d0.
  super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_d0.
  super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_d0.
  super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_b8[2] = 0.0;
  local_b8[3] = 0.0;
  local_a8 = (pointer)0x0;
  paStack_a0 = (pointer)0x0;
  local_98 = (pointer)0x0;
  afStack_90[0] = 0.0;
  afStack_90[1] = 0.0;
  afStack_90[2] = 0.0;
  afStack_90[3] = 0.0;
  local_80 = (pointer)0x0;
  paStack_78 = (pointer)0x0;
  local_70 = (pointer)0x0;
  if (!bVar31) {
    ConfigValueStr_abi_cxx11_(&local_58,devName,"decoder",pcVar27);
    auVar23 = local_180;
    local_180 = (undefined1  [8])((ulong)local_180 & 0xffffffffffffff00);
    local_178 = (BFormatDec **)0x0;
    sStack_170 = 0;
    local_168 = (BFormatDec *)0x0;
    afStack_160[0] = 0.0;
    afStack_160[1] = 0.0;
    if (local_58.mHasValue == true) {
      local_178 = &local_168;
      if (local_58.field_1.mValue._M_dataplus._M_p == (_Alloc_hider)((long)&local_58 + 0x18U)) {
        afStack_160[0] = (float)local_58.field_1._24_4_;
        afStack_160[1] = (float)local_58.field_1._28_4_;
      }
      else {
        local_178 = (BFormatDec **)local_58.field_1.mValue._M_dataplus._M_p;
      }
      local_168 = (BFormatDec *)CONCAT71(local_58.field_1._17_7_,local_58.field_1.mDummy[0x10]);
      sStack_170 = local_58.field_1.mValue._M_string_length;
      local_58.field_1.mValue._M_string_length = 0;
      local_58.field_1.mDummy[0x10] = '\0';
      local_180._1_7_ = auVar23._1_7_;
      local_180[0] = (default_delete<BFormatDec>)0x1;
      local_58.field_1.mValue._M_dataplus._M_p = (_Alloc_hider)((long)&local_58 + 0x18U);
    }
    if (local_180[0] == (default_delete<BFormatDec>)0x1) {
      iVar11 = AmbDecConf::load((AmbDecConf *)local_108,(char *)local_178);
      if (iVar11 == 0) {
        if (0 < (int)gLogLevel) {
          aluInitRenderer();
        }
        goto LAB_00159b9f;
      }
      if ((ulong)(((long)vStack_d0.
                         super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)vStack_d0.
                         super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333) <
          0x11) {
        if ((uint)uStack_e8._4_4_ < 0x10000) {
          bVar31 = anon_unknown.dwarf_20cafe::MakeSpeakerMap
                             (device,(AmbDecConf *)local_108,(ALuint (*) [16])&local_158);
          conf = (AmbDecConf *)0x0;
          if (bVar31) {
            conf = (AmbDecConf *)local_108;
          }
        }
        else {
          if ((int)gLogLevel < 1) goto LAB_00159b9f;
          fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unsupported channel mask 0x%04x (max 0x%x)\n");
          conf = (AmbDecConf *)0x0;
        }
      }
      else {
        if ((int)gLogLevel < 1) goto LAB_00159b9f;
        fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unsupported speaker count %zu (max %d)\n");
        conf = (AmbDecConf *)0x0;
      }
    }
    else {
LAB_00159b9f:
      conf = (AmbDecConf *)0x0;
    }
    if ((local_180[0] == (default_delete<BFormatDec>)0x1) && (local_178 != &local_168)) {
      operator_delete(local_178,(ulong)((long)(local_168->mSamples)._M_elems[0]._M_elems + 1));
    }
  }
  if ((((device->RealOut).ChannelIndex._M_elems[2] == 0xffffffff) ||
      ((device->RealOut).ChannelIndex._M_elems[0] == 0xffffffff)) ||
     ((device->RealOut).ChannelIndex._M_elems[1] == 0xffffffff)) {
    bVar31 = false;
  }
  else {
    iVar11 = GetConfigValueBool(devName,(char *)0x0,"front-stablizer",0);
    bVar31 = iVar11 != 0;
  }
  iVar11 = GetConfigValueBool(devName,"decoder","hq-mode",1);
  if (conf == (AmbDecConf *)0x0) {
    anon_unknown.dwarf_20cafe::InitPanning(device,iVar11 != 0,bVar31);
  }
  else {
    if (((iVar11 == 0) && (conf->FreqBands != 1)) && (0 < (int)gLogLevel)) {
      aluInitRenderer();
    }
    uVar21 = conf->ChanMask;
    order = 3;
    if (uVar21 < 0x200) {
      order = 2 - (uVar21 < 0x10);
    }
    device->mAmbiOrder = order;
    if ((uVar21 & 0xfe7ce4) == 0) {
      sVar26 = (size_t)(order * 2 + 1);
      uVar24 = 0;
      do {
        (device->Dry).AmbiMap._M_elems[uVar24] =
             (BFChannelConfig)((ulong)AmbiIndex::From2D._M_elems[uVar24] << 0x20 | 0x3f800000);
        uVar24 = uVar24 + 1;
      } while (sVar26 != uVar24);
    }
    else {
      sVar26 = (ulong)(order + 1) * (ulong)(order + 1);
      lVar19 = 0;
      do {
        (device->Dry).AmbiMap._M_elems[lVar19] =
             (BFChannelConfig)((ulong)AmbiIndex::FromACN._M_elems[lVar19] << 0x20 | 0x3f800000);
        lVar19 = lVar19 + 1;
      } while (sVar26 - lVar19 != 0);
    }
    uVar13 = ChannelsFromDevFmt(device->FmtChans,device->mAmbiOrder);
    anon_unknown.dwarf_20cafe::AllocChannels(device,sVar26,(ulong)uVar13);
    if (bVar31 == false) {
LAB_00159e32:
      auVar23 = (undefined1  [8])0x0;
    }
    else {
      lVar19 = (long)(conf->Speakers).
                     super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(conf->Speakers).
                     super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if (lVar19 == 0) {
        uVar24 = 0;
      }
      else {
        lVar19 = (lVar19 >> 4) * -0x3333333333333333;
        uVar20 = lVar19 + (ulong)(lVar19 == 0);
        uVar14 = 0;
        do {
          uVar24 = uVar14;
          if (*(int *)(&local_158.mHasValue + uVar14 * 4) == 2) break;
          uVar14 = uVar14 + 1;
          uVar24 = uVar20;
        } while (uVar20 != uVar14);
      }
      paVar5 = (conf->LFMatrix).
               super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (uVar24 < (ulong)((long)(conf->LFMatrix).
                                 super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 6)) {
        lVar19 = 0;
        auVar35 = (undefined1  [16])0x0;
        do {
          pfVar2 = paVar5[uVar24]._M_elems + lVar19;
          auVar37._4_4_ = -(uint)(pfVar2[1] != 0.0);
          auVar37._0_4_ = -(uint)(*pfVar2 != 0.0);
          auVar37._8_4_ = -(uint)(pfVar2[2] != 0.0);
          auVar37._12_4_ = -(uint)(pfVar2[3] != 0.0);
          auVar37 = packssdw(auVar37,auVar37);
          auVar37 = packsswb(auVar37,auVar37);
          auVar35 = auVar35 | auVar37 & _DAT_001912a0;
          lVar19 = lVar19 + 4;
        } while (lVar19 != 0x10);
        auVar34._0_4_ = auVar35._0_4_ >> 0x10;
        auVar34._4_4_ = 0;
        auVar34._8_4_ = auVar35._8_4_ >> 0x10;
        auVar34._12_4_ = auVar35._12_4_ >> 0x10;
        uVar21 = (uint)(ushort)(SUB162(auVar34 | auVar35,0) >> 8) | SUB164(auVar34 | auVar35,0);
      }
      else {
        uVar21 = 0;
      }
      if (((uVar21 & 1) == 0) &&
         (paVar5 = (conf->HFMatrix).
                   super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         uVar24 < (ulong)((long)(conf->HFMatrix).
                                super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 6))) {
        auVar35 = ZEXT416(uVar21 & 0xff);
        lVar19 = 0;
        do {
          pfVar2 = paVar5[uVar24]._M_elems + lVar19;
          auVar38._4_4_ = -(uint)(pfVar2[1] != 0.0);
          auVar38._0_4_ = -(uint)(*pfVar2 != 0.0);
          auVar38._8_4_ = -(uint)(pfVar2[2] != 0.0);
          auVar38._12_4_ = -(uint)(pfVar2[3] != 0.0);
          auVar37 = packssdw(auVar38,auVar38);
          auVar37 = packsswb(auVar37,auVar37);
          auVar35 = auVar35 | auVar37 & _DAT_001912a0;
          lVar19 = lVar19 + 4;
        } while (lVar19 != 0x10);
        auVar36._0_4_ = auVar35._0_4_ >> 0x10;
        auVar36._4_4_ = 0;
        auVar36._8_4_ = auVar35._8_4_ >> 0x10;
        auVar36._12_4_ = auVar35._12_4_ >> 0x10;
        uVar21 = (uint)(ushort)(SUB162(auVar36 | auVar35,0) >> 8) | SUB164(auVar36 | auVar35,0);
      }
      if ((uVar21 & 1) != 0) goto LAB_00159e32;
      uVar13 = ChannelsFromDevFmt(device->FmtChans,device->mAmbiOrder);
      anon_unknown.dwarf_20cafe::CreateStablizer((size_t)local_180,uVar13);
      auVar23 = local_180;
      if (2 < (int)gLogLevel) {
        aluInitRenderer();
      }
    }
    if (2 < (int)gLogLevel) {
      aluInitRenderer();
    }
    local_58._0_8_ = auVar23;
    BFormatDec::Create((BFormatDec *)local_180,conf,iVar11 != 0,sVar26,device->Frequency,
                       (ALuint (*) [16])&local_158,
                       (unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)&local_58
                      );
    auVar23 = local_180;
    local_180 = (undefined1  [8])0x0;
    pBVar6 = (device->AmbiDecoder)._M_t.
             super___uniq_ptr_impl<BFormatDec,_std::default_delete<BFormatDec>_>._M_t.
             super__Tuple_impl<0UL,_BFormatDec_*,_std::default_delete<BFormatDec>_>.
             super__Head_base<0UL,_BFormatDec_*,_false>._M_head_impl;
    (device->AmbiDecoder)._M_t.super___uniq_ptr_impl<BFormatDec,_std::default_delete<BFormatDec>_>.
    _M_t.super__Tuple_impl<0UL,_BFormatDec_*,_std::default_delete<BFormatDec>_>.
    super__Head_base<0UL,_BFormatDec_*,_false>._M_head_impl = (BFormatDec *)auVar23;
    if (pBVar6 != (BFormatDec *)0x0) {
      std::default_delete<BFormatDec>::operator()
                ((default_delete<BFormatDec> *)&device->AmbiDecoder,pBVar6);
    }
    if (local_180 != (undefined1  [8])0x0) {
      std::default_delete<BFormatDec>::operator()
                ((default_delete<BFormatDec> *)local_180,(BFormatDec *)local_180);
    }
    local_180 = (undefined1  [8])0x0;
    if ((_Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>)local_58._0_8_ !=
        (FrontStablizer *)0x0) {
      al_free((void *)local_58._0_8_);
    }
    local_58._0_8_ = (_Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>)0x0;
    pSVar7 = (conf->Speakers).
             super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    fVar32 = 0.0;
    pSVar15 = (conf->Speakers).
              super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (pSVar22 = pSVar15; pSVar22 != pSVar7; pSVar22 = pSVar22 + 1) {
      fVar32 = fVar32 + pSVar22->Distance;
    }
    anon_unknown.dwarf_20cafe::InitNearFieldCtrl
              (device,fVar32 / (float)(ulong)(((long)pSVar7 - (long)pSVar15 >> 4) *
                                             -0x3333333333333333),order,
               (conf->ChanMask & 0xfe7ce4) != 0);
    fVar32 = 0.0;
    for (pSVar15 = (conf->Speakers).
                   super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pSVar15 !=
        (conf->Speakers).
        super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>.
        _M_impl.super__Vector_impl_data._M_finish; pSVar15 = pSVar15 + 1) {
      if (fVar32 <= pSVar15->Distance) {
        fVar32 = pSVar15->Distance;
      }
    }
    local_188 = (pointer)CONCAT44(local_188._4_4_,fVar32);
    iVar11 = GetConfigValueBool((device->DeviceName)._M_dataplus._M_p,"decoder","distance-comp",1);
    if ((0.0 < local_188._0_4_) && (iVar11 != 0)) {
      pSVar15 = (conf->Speakers).
                super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((conf->Speakers).
          super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>.
          _M_impl.super__Vector_impl_data._M_finish == pSVar15) {
        sVar26 = 0;
        this_00 = &device->ChannelDelay;
      }
      else {
        local_10c = (float)device->Frequency / 343.3;
        lVar19 = 8;
        sVar26 = 0;
        uVar24 = 0;
        local_60 = &device->ChannelDelay;
        fVar32 = local_188._0_4_;
        do {
          uVar14 = (ulong)*(uint *)(&local_158.mHasValue + uVar24 * 4);
          fVar33 = floorf((fVar32 - *(float *)((long)&(pSVar15->Name)._M_dataplus._M_p + lVar19 * 4)
                          ) * local_10c + 0.5);
          fVar32 = fVar33;
          if ((1023.0 < fVar33) && (fVar32 = 1023.0, 0 < (int)gLogLevel)) {
            fprintf((FILE *)gLogFile,
                    "[ALSOFT] (EE) Delay for speaker \"%s\" exceeds buffer length (%f > %d)\n",
                    (double)fVar33,*(undefined8 *)((long)pSVar15 + lVar19 * 4 + -0x20),0x3ff);
            fVar32 = 1023.0;
          }
          (local_60->mChannels)._M_elems[uVar14].Length = (ALuint)(long)fVar32;
          fVar32 = *(float *)((long)&(pSVar15->Name)._M_dataplus._M_p + lVar19 * 4) /
                   local_188._0_4_;
          (local_60->mChannels)._M_elems[uVar14].Gain = fVar32;
          if (2 < (int)gLogLevel) {
            fprintf((FILE *)gLogFile,
                    "[ALSOFT] (II) Channel %u \"%s\" distance compensation: %u samples, %f gain\n",
                    (double)fVar32,uVar14,*(undefined8 *)((long)pSVar15 + lVar19 * 4 + -0x20));
          }
          sVar26 = sVar26 + ((ulong)(local_60->mChannels)._M_elems[uVar14].Length + 3 & 0x1fffffffc)
          ;
          uVar24 = uVar24 + 1;
          pSVar15 = (conf->Speakers).
                    super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar19 = lVar19 + 0x14;
          this_00 = local_60;
          fVar32 = local_188._0_4_;
        } while (uVar24 < (ulong)(((long)(conf->Speakers).
                                         super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar15
                                  >> 4) * -0x3333333333333333));
      }
      if (sVar26 != 0) {
        DistanceComp::setSampleCount(this_00,sVar26);
        uVar24._0_4_ = (device->ChannelDelay).mChannels._M_elems[0].Gain;
        uVar24._4_4_ = (device->ChannelDelay).mChannels._M_elems[0].Length;
        paVar16 = &((device->ChannelDelay).mSamples._M_t.
                    super___uniq_ptr_impl<al::FlexArray<float,_16UL>,_std::default_delete<al::FlexArray<float,_16UL>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_al::FlexArray<float,_16UL>_*,_std::default_delete<al::FlexArray<float,_16UL>_>_>
                    .super__Head_base<0UL,_al::FlexArray<float,_16UL>_*,_false>._M_head_impl)->
                   field_1;
        (device->ChannelDelay).mChannels._M_elems[0].Buffer = (float *)paVar16;
        lVar19 = 0;
        do {
          uVar14 = uVar24 >> 0x20;
          uVar24 = *(ulong *)((long)&(device->ChannelDelay).mChannels._M_elems[1].Gain + lVar19);
          paVar16 = (anon_union_16_2_dde17770_for_FlexArray<float,_16UL>_3 *)
                    (paVar16->mArray + (uVar14 + 3 & 0x1fffffffc));
          *(anon_union_16_2_dde17770_for_FlexArray<float,_16UL>_3 **)
           ((long)&(device->ChannelDelay).mChannels._M_elems[1].Buffer + lVar19) = paVar16;
          lVar19 = lVar19 + 0x10;
        } while (lVar19 != 0xf0);
      }
    }
  }
  pBVar6 = (device->AmbiDecoder)._M_t.
           super___uniq_ptr_impl<BFormatDec,_std::default_delete<BFormatDec>_>._M_t.
           super__Tuple_impl<0UL,_BFormatDec_*,_std::default_delete<BFormatDec>_>.
           super__Head_base<0UL,_BFormatDec_*,_false>._M_head_impl;
  if (pBVar6 != (BFormatDec *)0x0) {
    if ((_Head_base<0UL,_FrontStablizer_*,_false>)
        *(_Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_> *)
         &(pBVar6->mStablizer)._M_t.
          super___uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_> ==
        (FrontStablizer *)0x0) {
      pcVar18 = ALCdevice::ProcessAmbiDec;
    }
    else {
      pcVar18 = ALCdevice::ProcessAmbiDecStablized;
    }
    device->PostProcess = (PostProc)pcVar18;
    *(undefined8 *)&device->field_0x6e98 = 0;
  }
  if (local_80 != (pointer)0x0) {
    al_free(local_80);
  }
  if (local_a8 != (pointer)0x0) {
    al_free(local_a8);
  }
  std::vector<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>::~vector
            (&vStack_d0);
  if (local_108 != (undefined1  [8])auStack_f8) {
    operator_delete((void *)local_108,(ulong)(auStack_f8._0_8_ + 1));
  }
LAB_0015ab46:
  al::intrusive_ptr<HrtfStore>::~intrusive_ptr(&local_190);
  return;
}

Assistant:

void aluInitRenderer(ALCdevice *device, int hrtf_id, HrtfRequestMode hrtf_appreq,
    HrtfRequestMode hrtf_userreq)
{
    /* Hold the HRTF the device last used, in case it's used again. */
    HrtfStorePtr old_hrtf{std::move(device->mHrtf)};

    device->mHrtfState = nullptr;
    device->mHrtf = nullptr;
    device->HrtfName.clear();
    device->mRenderMode = RenderMode::Normal;

    if(device->FmtChans != DevFmtStereo)
    {
        old_hrtf = nullptr;
        if(hrtf_appreq == Hrtf_Enable)
            device->HrtfStatus = ALC_HRTF_UNSUPPORTED_FORMAT_SOFT;

        const char *layout{nullptr};
        switch(device->FmtChans)
        {
            case DevFmtQuad: layout = "quad"; break;
            case DevFmtX51: /* fall-through */
            case DevFmtX51Rear: layout = "surround51"; break;
            case DevFmtX61: layout = "surround61"; break;
            case DevFmtX71: layout = "surround71"; break;
            /* Mono, Stereo, and Ambisonics output don't use custom decoders. */
            case DevFmtMono:
            case DevFmtStereo:
            case DevFmtAmbi3D:
                break;
        }

        const char *devname{device->DeviceName.c_str()};
        ALuint speakermap[MAX_OUTPUT_CHANNELS];
        AmbDecConf *pconf{nullptr};
        AmbDecConf conf{};
        if(layout)
        {
            if(auto decopt = ConfigValueStr(devname, "decoder", layout))
            {
                if(!conf.load(decopt->c_str()))
                    ERR("Failed to load layout file %s\n", decopt->c_str());
                else if(conf.Speakers.size() > MAX_OUTPUT_CHANNELS)
                    ERR("Unsupported speaker count %zu (max %d)\n", conf.Speakers.size(),
                        MAX_OUTPUT_CHANNELS);
                else if(conf.ChanMask > AMBI_3ORDER_MASK)
                    ERR("Unsupported channel mask 0x%04x (max 0x%x)\n", conf.ChanMask,
                        AMBI_3ORDER_MASK);
                else if(MakeSpeakerMap(device, &conf, speakermap))
                    pconf = &conf;
            }
        }

        /* Enable the stablizer only for formats that have front-left, front-
         * right, and front-center outputs.
         */
        const bool stablize{device->RealOut.ChannelIndex[FrontCenter] != INVALID_CHANNEL_INDEX
            && device->RealOut.ChannelIndex[FrontLeft] != INVALID_CHANNEL_INDEX
            && device->RealOut.ChannelIndex[FrontRight] != INVALID_CHANNEL_INDEX
            && GetConfigValueBool(devname, nullptr, "front-stablizer", 0) != 0};
        const bool hqdec{GetConfigValueBool(devname, "decoder", "hq-mode", 1) != 0};
        if(!pconf)
            InitPanning(device, hqdec, stablize);
        else
            InitCustomPanning(device, hqdec, stablize, pconf, speakermap);
        if(auto *ambidec{device->AmbiDecoder.get()})
        {
            device->PostProcess = ambidec->hasStablizer() ? &ALCdevice::ProcessAmbiDecStablized
                : &ALCdevice::ProcessAmbiDec;
        }
        return;
    }

    bool headphones{device->IsHeadphones};
    if(device->Type != DeviceType::Loopback)
    {
        if(auto modeopt = ConfigValueStr(device->DeviceName.c_str(), nullptr, "stereo-mode"))
        {
            const char *mode{modeopt->c_str()};
            if(al::strcasecmp(mode, "headphones") == 0)
                headphones = true;
            else if(al::strcasecmp(mode, "speakers") == 0)
                headphones = false;
            else if(al::strcasecmp(mode, "auto") != 0)
                ERR("Unexpected stereo-mode: %s\n", mode);
        }
    }

    if(hrtf_userreq == Hrtf_Default)
    {
        bool usehrtf = (headphones && hrtf_appreq != Hrtf_Disable) ||
                       (hrtf_appreq == Hrtf_Enable);
        if(!usehrtf) goto no_hrtf;

        device->HrtfStatus = ALC_HRTF_ENABLED_SOFT;
        if(headphones && hrtf_appreq != Hrtf_Disable)
            device->HrtfStatus = ALC_HRTF_HEADPHONES_DETECTED_SOFT;
    }
    else
    {
        if(hrtf_userreq != Hrtf_Enable)
        {
            if(hrtf_appreq == Hrtf_Enable)
                device->HrtfStatus = ALC_HRTF_DENIED_SOFT;
            goto no_hrtf;
        }
        device->HrtfStatus = ALC_HRTF_REQUIRED_SOFT;
    }

    if(device->HrtfList.empty())
        device->HrtfList = EnumerateHrtf(device->DeviceName.c_str());

    if(hrtf_id >= 0 && static_cast<ALuint>(hrtf_id) < device->HrtfList.size())
    {
        const char *devname{device->DeviceName.c_str()};
        const std::string &hrtfname = device->HrtfList[static_cast<ALuint>(hrtf_id)];
        if(HrtfStorePtr hrtf{GetLoadedHrtf(hrtfname, devname, device->Frequency)})
        {
            device->mHrtf = std::move(hrtf);
            device->HrtfName = hrtfname;
        }
    }

    if(!device->mHrtf)
    {
        const char *devname{device->DeviceName.c_str()};
        for(const auto &hrtfname : device->HrtfList)
        {
            if(HrtfStorePtr hrtf{GetLoadedHrtf(hrtfname, devname, device->Frequency)})
            {
                device->mHrtf = std::move(hrtf);
                device->HrtfName = hrtfname;
                break;
            }
        }
    }

    if(device->mHrtf)
    {
        old_hrtf = nullptr;

        InitHrtfPanning(device);
        device->PostProcess = &ALCdevice::ProcessHrtf;
        return;
    }
    device->HrtfStatus = ALC_HRTF_UNSUPPORTED_FORMAT_SOFT;

no_hrtf:
    old_hrtf = nullptr;

    device->mRenderMode = RenderMode::Pairwise;

    if(device->Type != DeviceType::Loopback)
    {
        if(auto cflevopt = ConfigValueInt(device->DeviceName.c_str(), nullptr, "cf_level"))
        {
            if(*cflevopt > 0 && *cflevopt <= 6)
            {
                device->Bs2b = std::make_unique<bs2b>();
                bs2b_set_params(device->Bs2b.get(), *cflevopt,
                    static_cast<int>(device->Frequency));
                TRACE("BS2B enabled\n");
                InitPanning(device);
                device->PostProcess = &ALCdevice::ProcessBs2b;
                return;
            }
        }
    }

    if(auto encopt = ConfigValueStr(device->DeviceName.c_str(), nullptr, "stereo-encoding"))
    {
        const char *mode{encopt->c_str()};
        if(al::strcasecmp(mode, "uhj") == 0)
            device->mRenderMode = RenderMode::Normal;
        else if(al::strcasecmp(mode, "panpot") != 0)
            ERR("Unexpected stereo-encoding: %s\n", mode);
    }
    if(device->mRenderMode == RenderMode::Normal)
    {
        device->Uhj_Encoder = std::make_unique<Uhj2Encoder>();
        TRACE("UHJ enabled\n");
        InitUhjPanning(device);
        device->PostProcess = &ALCdevice::ProcessUhj;
        return;
    }

    TRACE("Stereo rendering\n");
    InitPanning(device);
    device->PostProcess = &ALCdevice::ProcessAmbiDec;
}